

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void __thiscall google::protobuf::FatalException::~FatalException(FatalException *this)

{
  *(undefined ***)this = &PTR__FatalException_0042a0b8;
  std::__cxx11::string::~string((string *)&this->message_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

FatalException::~FatalException() throw() {}